

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceGLImpl.cpp
# Opt level: O0

Uint64 __thiscall Diligent::FenceGLImpl::GetCompletedValue(FenceGLImpl *this)

{
  PFNGLCLIENTWAITSYNCPROC p_Var1;
  bool bVar2;
  GLenum GVar3;
  reference pvVar4;
  GLsync p_Var5;
  GLenum res;
  value_type *val_fence;
  FenceGLImpl *this_local;
  memory_order __b;
  
  while (bVar2 = std::
                 deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
                 ::empty(&this->m_PendingFences), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
             ::front(&this->m_PendingFences);
    p_Var1 = __glewClientWaitSync;
    p_Var5 = GLObjectWrappers::GLSyncObj::operator_cast_to___GLsync_(&pvVar4->second);
    GVar3 = (*p_Var1)(p_Var5,0,0);
    if (GVar3 != 0x911a) break;
    FenceBase<Diligent::EngineGLImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineGLImplTraits>,pvVar4->first);
    std::
    deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
    ::pop_front(&this->m_PendingFences);
  }
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceGLImpl::GetCompletedValue()
{
    while (!m_PendingFences.empty())
    {
        auto& val_fence = m_PendingFences.front();

        auto res =
            glClientWaitSync(val_fence.second,
                             0, // Can be SYNC_FLUSH_COMMANDS_BIT
                             0  // Timeout in nanoseconds
            );
        if (res == GL_ALREADY_SIGNALED)
        {
            UpdateLastCompletedFenceValue(val_fence.first);
            m_PendingFences.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}